

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_rbtree.c
# Opt level: O0

_Bool rbt_is_empty(RBTree *rbt)

{
  RBTree *rbt_local;
  
  return rbt->root == &g_sentinel;
}

Assistant:

bool rbt_is_empty(const RBTree* rbt) {
    return rbt->root == RBTNIL;
#if 0
    bool ret1 = (rbt->root == RBTNIL);

    RBTreeIterator itr;
    RBTNode* node;
    rbt_begin_iterate((RBTree *)rbt, LeftRightWalk, &itr);

    node = rbt_iterate(&itr);
    bool ret2 = (node == NULL);

    if (ret1 != ret2) {
#ifndef NDEBUG
        fprintf(stderr, "is_empty\n");
#endif
        /* exit(0); */
    }
    return ret1;
#endif
}